

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitives.c
# Opt level: O2

int lws_mqtt_vbi_encode(uint32_t value,void *buf)

{
  bool bVar1;
  long lVar2;
  byte bVar3;
  uint8_t *p;
  
  if (value < 0x10000000) {
    lVar2 = 0;
    do {
      bVar3 = (byte)value | 0x80;
      if (value < 0x80) {
        bVar3 = (byte)value;
      }
      *(byte *)((long)buf + lVar2) = bVar3;
      lVar2 = lVar2 + 1;
      bVar1 = 0x7f < value;
      value = value >> 7;
    } while (bVar1);
    return (int)lVar2;
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dmikushin[P]libwebsockets/lib/roles/mqtt/primitives.c"
                ,0x32,"int lws_mqtt_vbi_encode(uint32_t, void *)");
}

Assistant:

int
lws_mqtt_vbi_encode(uint32_t value, void *buf)
{
	uint8_t *p = (uint8_t *)buf, b;

	if (value > 0xfffffff) {
		assert(0);
		return -1;
	}

	do {
		b = value & 0x7f;
		value >>= 7;
		if (value)
			*p++ = (0x80 | b);
		else
			*p++ = b;
	} while (value);

	return p - (uint8_t *)buf;
}